

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * createTableStmt(sqlite3 *db,Table *p)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  char *zType;
  int len;
  Column *pCol;
  char *zEnd;
  char *zSep2;
  char *zSep;
  char *zStmt;
  int n;
  int i;
  int k;
  char *in_stack_ffffffffffffff88;
  sqlite3 *in_stack_ffffffffffffff90;
  sqlite3 *in_stack_ffffffffffffff98;
  char *__src;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  int *piVar6;
  char *z;
  char *local_48;
  char *local_40;
  int local_30;
  int local_2c;
  char *local_18;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  piVar6 = (int *)in_RSI[1];
  for (local_2c = 0; local_2c < *(short *)((long)in_RSI + 0x36); local_2c = local_2c + 1) {
    iVar2 = identLength(*(char **)piVar6);
    local_30 = iVar2 + 5 + local_30;
    piVar6 = piVar6 + 4;
  }
  iVar2 = identLength((char *)*in_RSI);
  if (iVar2 + local_30 < 0x32) {
    local_40 = "";
    local_48 = ",";
    z = ")";
  }
  else {
    local_40 = "\n  ";
    local_48 = ",\n  ";
    z = "\n)";
  }
  uVar3 = *(short *)((long)in_RSI + 0x36) * 6 + 0x23 + iVar2 + local_30;
  local_18 = (char *)sqlite3DbMallocRaw(in_stack_ffffffffffffff98,(u64)in_stack_ffffffffffffff90);
  if (local_18 == (char *)0x0) {
    sqlite3OomFault(in_stack_ffffffffffffff90);
    local_18 = (char *)0x0;
  }
  else {
    sqlite3_snprintf((int)(ulong)uVar3,local_18,"CREATE TABLE ");
    iVar2 = sqlite3Strlen30(in_stack_ffffffffffffff88);
    identPut(z,piVar6,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_c = iVar2 + 1;
    local_18[iVar2] = '(';
    piVar6 = (int *)in_RSI[1];
    for (local_2c = 0; local_2c < *(short *)((long)in_RSI + 0x36); local_2c = local_2c + 1) {
      uVar5 = 0xaaaaaaaa;
      sqlite3_snprintf((int)(ulong)(uVar3 - local_c),local_18 + local_c,local_40);
      iVar2 = sqlite3Strlen30(in_stack_ffffffffffffff88);
      local_40 = local_48;
      identPut(z,piVar6,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
      __src = createTableStmt::azType[*(char *)((long)piVar6 + 9) + -0x41];
      iVar4 = sqlite3Strlen30(in_stack_ffffffffffffff88);
      memcpy(local_18 + (iVar2 + local_c),__src,(long)iVar4);
      local_c = iVar4 + iVar2 + local_c;
      piVar6 = piVar6 + 4;
    }
    sqlite3_snprintf((int)(ulong)(uVar3 - local_c),local_18 + local_c,"%s",z);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zCnName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL",
        /* SQLITE_AFF_FLEXNUM */ " NUM",
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zCnName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    testcase( pCol->affinity==SQLITE_AFF_FLEXNUM );

    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB
            || pCol->affinity==SQLITE_AFF_FLEXNUM
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}